

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cpp
# Opt level: O1

ContainerScanState * __thiscall
duckdb::roaring::RoaringScanState::LoadContainer
          (RoaringScanState *this,idx_t container_index,idx_t internal_offset)

{
  value_type vVar1;
  uint8_t *this_00;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  _Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false> _Var5;
  pointer pCVar6;
  type pCVar7;
  undefined *puVar8;
  idx_t container_size;
  _Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false> _Var9;
  uint uVar10;
  data_ptr_t pdVar11;
  data_ptr_t segments;
  validity_t *bitset;
  
  bVar2 = UseContainerStateCache(this,container_index,internal_offset);
  if (bVar2) goto LAB_0105b2e2;
  pvVar3 = vector<duckdb::roaring::ContainerMetadata,_true>::operator[]
                     (&this->container_metadata,container_index);
  vVar1 = *pvVar3;
  uVar10 = (uint)vVar1 >> 0x10;
  pdVar11 = this->data_ptr;
  pvVar4 = vector<unsigned_long,_true>::operator[](&this->data_start_position,container_index);
  bitset = (validity_t *)(pdVar11 + *pvVar4);
  container_size =
       (this->segment->super_SegmentBase<duckdb::ColumnSegment>).count.
       super___atomic_base<unsigned_long>._M_i + container_index * -0x800;
  if (0x7ff < container_size) {
    container_size = 0x800;
  }
  if (vVar1.container_type == RUN_CONTAINER) {
    if ((uint)vVar1 < 0x40000) {
      _Var5._M_head_impl = (ContainerScanState *)operator_new(0x40);
      RunContainerScanState::RunContainerScanState
                ((RunContainerScanState *)_Var5._M_head_impl,container_index,container_size,
                 (ulong)uVar10,(data_ptr_t)bitset);
    }
    else {
      _Var5._M_head_impl = (ContainerScanState *)operator_new(0x58);
      CompressedRunContainerScanState::CompressedRunContainerScanState
                ((CompressedRunContainerScanState *)_Var5._M_head_impl,container_index,
                 container_size,(ulong)uVar10,(data_ptr_t)bitset,(data_ptr_t)(bitset + 1));
    }
LAB_0105b287:
    _Var9._M_head_impl =
         (this->current_container).
         super_unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::roaring::ContainerScanState_*,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         .super__Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false>._M_head_impl;
    (this->current_container).
    super_unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::roaring::ContainerScanState_*,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    .super__Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false>._M_head_impl =
         _Var5._M_head_impl;
  }
  else {
    if (((uint)vVar1 & 0xff) == 2) {
      _Var5._M_head_impl = (ContainerScanState *)operator_new(0x28);
      BitsetContainerScanState::BitsetContainerScanState
                ((BitsetContainerScanState *)_Var5._M_head_impl,container_index,container_size,
                 bitset);
      goto LAB_0105b287;
    }
    pdVar11 = (data_ptr_t)(ulong)uVar10;
    if (0x7ffff < (uint)vVar1) {
      _Var5._M_head_impl = (ContainerScanState *)operator_new(0x60);
      (((CompressedRunContainerScanState *)_Var5._M_head_impl)->super_RunContainerScanState).
      super_ContainerScanState._vptr_ContainerScanState =
           (_func_int **)&PTR__ContainerScanState_0248e3e0;
      (((CompressedRunContainerScanState *)_Var5._M_head_impl)->super_RunContainerScanState).
      super_ContainerScanState.container_index = container_index;
      (((CompressedRunContainerScanState *)_Var5._M_head_impl)->super_RunContainerScanState).
      super_ContainerScanState.container_size = container_size;
      (((CompressedRunContainerScanState *)_Var5._M_head_impl)->super_RunContainerScanState).
      super_ContainerScanState.scanned_count = 0;
      this_00 = &(((CompressedRunContainerScanState *)_Var5._M_head_impl)->segment).index;
      if (((uint)vVar1 >> 8 & 1) == 0) {
        (((CompressedRunContainerScanState *)_Var5._M_head_impl)->super_RunContainerScanState).
        run_index = (idx_t)(bitset + 1);
        *(undefined1 *)
         &(((CompressedRunContainerScanState *)_Var5._M_head_impl)->super_RunContainerScanState).
          count = 0;
        (((CompressedRunContainerScanState *)_Var5._M_head_impl)->super_RunContainerScanState).data
             = pdVar11;
        ((CompressedRunContainerScanState *)_Var5._M_head_impl)->segments = (data_ptr_t)0x0;
        (((CompressedRunContainerScanState *)_Var5._M_head_impl)->super_RunContainerScanState).
        super_ContainerScanState._vptr_ContainerScanState =
             (_func_int **)&PTR__ContainerScanState_0248e4c8;
        (((CompressedRunContainerScanState *)_Var5._M_head_impl)->segment).segments =
             (uint8_t *)bitset;
        ContainerSegmentScan::ContainerSegmentScan
                  ((ContainerSegmentScan *)this_00,(data_ptr_t)bitset);
      }
      else {
        (((CompressedRunContainerScanState *)_Var5._M_head_impl)->super_RunContainerScanState).
        run_index = (idx_t)(bitset + 1);
        *(undefined1 *)
         &(((CompressedRunContainerScanState *)_Var5._M_head_impl)->super_RunContainerScanState).
          count = 0;
        (((CompressedRunContainerScanState *)_Var5._M_head_impl)->super_RunContainerScanState).data
             = pdVar11;
        ((CompressedRunContainerScanState *)_Var5._M_head_impl)->segments = (data_ptr_t)0x0;
        (((CompressedRunContainerScanState *)_Var5._M_head_impl)->super_RunContainerScanState).
        super_ContainerScanState._vptr_ContainerScanState =
             (_func_int **)&PTR__ContainerScanState_0248e418;
        (((CompressedRunContainerScanState *)_Var5._M_head_impl)->segment).segments =
             (uint8_t *)bitset;
        ContainerSegmentScan::ContainerSegmentScan
                  ((ContainerSegmentScan *)this_00,(data_ptr_t)bitset);
      }
      goto LAB_0105b287;
    }
    _Var5._M_head_impl = (ContainerScanState *)operator_new(0x48);
    (_Var5._M_head_impl)->_vptr_ContainerScanState = (_func_int **)&PTR__ContainerScanState_0248e3e0
    ;
    (_Var5._M_head_impl)->container_index = container_index;
    (_Var5._M_head_impl)->container_size = container_size;
    (_Var5._M_head_impl)->scanned_count = 0;
    if (((uint)vVar1 >> 8 & 1) == 0) {
      puVar8 = &ArrayContainerScanState<false>::vtable;
    }
    else {
      puVar8 = &ArrayContainerScanState<true>::vtable;
    }
    (_Var5._M_head_impl)->_vptr_ContainerScanState = (_func_int **)(puVar8 + 0x10);
    _Var5._M_head_impl[1].container_index = (idx_t)bitset;
    *(undefined1 *)&_Var5._M_head_impl[1].container_size = 0;
    _Var5._M_head_impl[1].scanned_count = (idx_t)pdVar11;
    _Var5._M_head_impl[2]._vptr_ContainerScanState = (_func_int **)0x0;
    _Var9._M_head_impl =
         (this->current_container).
         super_unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::roaring::ContainerScanState_*,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         .super__Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false>._M_head_impl;
    (this->current_container).
    super_unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::roaring::ContainerScanState_*,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    .super__Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false>._M_head_impl =
         _Var5._M_head_impl;
  }
  if (_Var9._M_head_impl != (ContainerScanState *)0x0) {
    (*(_Var9._M_head_impl)->_vptr_ContainerScanState[1])();
  }
  pCVar6 = unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>,_true>
           ::operator->(&this->current_container);
  (*pCVar6->_vptr_ContainerScanState[4])(pCVar6);
  pCVar7 = unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>,_true>
           ::operator*(&this->current_container);
  if (internal_offset != 0) {
    if (pCVar7->scanned_count + internal_offset == pCVar7->container_size) {
      pCVar7->scanned_count = pCVar7->container_size;
    }
    else {
      (*pCVar7->_vptr_ContainerScanState[3])(pCVar7,internal_offset);
    }
  }
LAB_0105b2e2:
  pCVar7 = unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>,_true>
           ::operator*(&this->current_container);
  return pCVar7;
}

Assistant:

ContainerScanState &RoaringScanState::LoadContainer(idx_t container_index, idx_t internal_offset) {
	if (UseContainerStateCache(container_index, internal_offset)) {
		return *current_container;
	}
	auto metadata = GetContainerMetadata(container_index);
	auto data_ptr = GetStartOfContainerData(container_index);

	auto segment_count = segment.count.load();
	auto start_of_container = container_index * ROARING_CONTAINER_SIZE;
	auto container_size = MinValue<idx_t>(segment_count - start_of_container, ROARING_CONTAINER_SIZE);
	if (metadata.IsUncompressed()) {
		current_container = make_uniq<BitsetContainerScanState>(container_index, container_size,
		                                                        reinterpret_cast<validity_t *>(data_ptr));
	} else if (metadata.IsRun()) {
		D_ASSERT(metadata.IsInverted());
		auto number_of_runs = metadata.NumberOfRuns();
		if (number_of_runs >= COMPRESSED_RUN_THRESHOLD) {
			auto segments = data_ptr;
			data_ptr = segments + COMPRESSED_SEGMENT_COUNT;
			current_container = make_uniq<CompressedRunContainerScanState>(container_index, container_size,
			                                                               number_of_runs, segments, data_ptr);
		} else {
			D_ASSERT(AlignValue<sizeof(RunContainerRLEPair)>(data_ptr) == data_ptr);
			current_container =
			    make_uniq<RunContainerScanState>(container_index, container_size, number_of_runs, data_ptr);
		}
	} else {
		auto cardinality = metadata.Cardinality();
		if (cardinality >= COMPRESSED_ARRAY_THRESHOLD) {
			auto segments = data_ptr;
			data_ptr = segments + COMPRESSED_SEGMENT_COUNT;
			if (metadata.IsInverted()) {
				current_container = make_uniq<CompressedArrayContainerScanState<NULLS>>(
				    container_index, container_size, cardinality, segments, data_ptr);
			} else {
				current_container = make_uniq<CompressedArrayContainerScanState<NON_NULLS>>(
				    container_index, container_size, cardinality, segments, data_ptr);
			}
		} else {
			D_ASSERT(AlignValue<sizeof(uint16_t)>(data_ptr) == data_ptr);
			if (metadata.IsInverted()) {
				current_container =
				    make_uniq<ArrayContainerScanState<NULLS>>(container_index, container_size, cardinality, data_ptr);
			} else {
				current_container = make_uniq<ArrayContainerScanState<NON_NULLS>>(container_index, container_size,
				                                                                  cardinality, data_ptr);
			}
		}
	}

	current_container->Verify();

	auto &scan_state = *current_container;
	if (internal_offset) {
		Skip(scan_state, internal_offset);
	}
	return *current_container;
}